

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def.h
# Opt level: O1

void __thiscall format::CSC::CSC(CSC *this,size_t M,size_t N,size_t NNZ,bool is_p,int st)

{
  int *piVar1;
  double *__s;
  ulong uVar2;
  
  this->m = M;
  this->n = N;
  this->nnz = NNZ;
  this->stype = st;
  this->is_pattern = is_p;
  this->pre_alloc = false;
  this->p = (int *)0x0;
  this->i = (int *)0x0;
  this->x = (double *)0x0;
  if (N == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    if (N + 1 < 0x4000000000000000) {
      uVar2 = N * 4 + 4;
    }
    piVar1 = (int *)operator_new__(uVar2);
    memset(piVar1,0,uVar2);
  }
  this->p = piVar1;
  if (NNZ == 0) {
    this->i = (int *)0x0;
    __s = (double *)0x0;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    if (NNZ < 0x4000000000000000) {
      uVar2 = NNZ * 4;
    }
    piVar1 = (int *)operator_new__(uVar2);
    memset(piVar1,0,uVar2);
    this->i = piVar1;
    uVar2 = -(ulong)(NNZ >> 0x3d != 0) | NNZ << 3;
    __s = (double *)operator_new__(uVar2);
    memset(__s,0,uVar2);
  }
  this->x = __s;
  return;
}

Assistant:

CSC(size_t M, size_t N, size_t NNZ, bool is_p, int st) :
   m(M), n(N), nnz(NNZ), is_pattern(is_p), stype(st),
   p(NULLPNTR), i(NULLPNTR), x(NULLPNTR) {
    pre_alloc = false;
    if (N > 0)
     p = new int[N + 1]();
    else
     p = NULLPNTR;
    if (NNZ > 0) {
     i = new int[NNZ]();
     x = new double[NNZ]();
    } else {
     i = NULLPNTR;
     x = NULLPNTR;
    }
   }